

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

QString * __thiscall
MakefileGenerator::createSedArgs
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProKey *replace_rule,
          QString *file_name)

{
  QMakeProject *pQVar1;
  qsizetype qVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  longlong __old_val;
  ProStringList *pPVar6;
  long lVar7;
  ulong uVar8;
  MakefileGenerator *pMVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QStringView QVar11;
  QLatin1String QVar12;
  QStringView config;
  ProString filename;
  ProString replace;
  ProString match;
  QString local_210;
  QString local_1f8;
  QString local_1e0;
  QString local_1c8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
  local_1a8;
  undefined1 local_168 [32];
  Data *local_148;
  QMakeLocalFileName *local_140;
  char16_t *pcStack_138;
  Data *local_130;
  char *local_128;
  QString local_120;
  QStringBuilder<const_char_(&)[5],_QString> local_108;
  QString local_e8;
  undefined1 local_c8 [28];
  int iStack_ac;
  QHash<QString,_QList<QString>_> local_a8;
  QHash<ReplaceExtraCompilerCacheKey,_QString> QStack_a0;
  undefined1 local_98 [32];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar4 = QMakeProject::isEmpty(this->project,replace_rule);
  if (!bVar4) {
    pQVar1 = this->project;
    QVar10.m_data = (storage_type *)0x13;
    QVar10.m_size = (qsizetype)local_168;
    QString::fromUtf8(QVar10);
    uVar3 = local_168._0_8_;
    config.m_data = (storage_type_conflict *)local_168._8_8_;
    config.m_size = local_168._16_8_;
    bVar4 = QMakeEvaluator::isActiveConfig(&pQVar1->super_QMakeEvaluator,config,false);
    if ((QArrayData *)uVar3 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)uVar3)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)uVar3,2,0x10);
      }
    }
    if (!bVar4) {
      pPVar6 = QMakeEvaluator::valuesRef(&this->project->super_QMakeEvaluator,replace_rule);
      if ((pPVar6->super_QList<ProString>).d.size != 0) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
          local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = this->project;
          local_1a8.a.a.a =
               (char (*) [3])
               ((long)&(((pPVar6->super_QList<ProString>).d.ptr)->m_string).d.d + lVar7);
          local_1a8.a.a.b.d.d = (Data *)0x2ad8e3;
          ProString::ProString<ProString_const&,char_const(&)[7]>
                    ((ProString *)local_168,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)&local_1a8);
          QMakeEvaluator::first
                    ((ProString *)local_68,&pQVar1->super_QMakeEvaluator,(ProKey *)local_168);
          if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
            }
          }
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = this->project;
          local_1a8.a.a.a =
               (char (*) [3])
               ((long)&(((pPVar6->super_QList<ProString>).d.ptr)->m_string).d.d + lVar7);
          local_1a8.a.a.b.d.d = (Data *)0x2ad8ea;
          ProString::ProString<ProString_const&,char_const(&)[9]>
                    ((ProString *)local_168,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&local_1a8);
          QMakeEvaluator::first
                    ((ProString *)local_98,&pQVar1->super_QMakeEvaluator,(ProKey *)local_168);
          if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
            }
          }
          local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QStack_a0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_c8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          stack0xffffffffffffff50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = this->project;
          local_1a8.a.a.a =
               (char (*) [3])
               ((long)&(((pPVar6->super_QList<ProString>).d.ptr)->m_string).d.d + lVar7);
          local_1a8.a.a.b.d.d = (Data *)0x2ad8f3;
          ProString::ProString<ProString_const&,char_const(&)[10]>
                    ((ProString *)local_168,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&local_1a8);
          QMakeEvaluator::first
                    ((ProString *)local_c8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_168);
          if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
            }
          }
          if (iStack_4c != 0) {
            if (iStack_ac != 0) {
              bVar4 = ProString::operator==((ProString *)local_c8,file_name);
              if (!bVar4) goto LAB_0016bf58;
            }
            local_168._0_8_ = anon_var_dwarf_1585ec;
            local_168._8_8_ = local_68;
            local_168._16_8_ = ",";
            local_168._24_8_ = local_98;
            local_148 = (Data *)0x2ad905;
            pMVar9 = (MakefileGenerator *)local_168;
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
            ::convertTo<QString>
                      (&local_e8,
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_const_ProString_&>,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[3]>
                        *)local_168);
            shellQuote((QString *)&local_108,pMVar9,&local_e8);
            local_1a8.a.a.b.d.size = (qsizetype)local_108.b.d.ptr;
            local_1a8.a.a.b.d.ptr = (char16_t *)local_108.b.d.d;
            local_1a8.a.a.b.d.d = (Data *)local_108.a;
            local_1a8.a.a.a = (char (*) [3])anon_var_dwarf_1585df;
            local_108.a = (char (*) [5])0x0;
            local_108.b.d.d = (Data *)0x0;
            local_108.b.d.ptr = (char16_t *)0x0;
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<const_char_(&)[5],_QString> *)&local_1a8);
            if (&(local_1a8.a.a.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_1a8.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = ((local_1a8.a.a.b.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((local_1a8.a.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate(&(local_1a8.a.a.b.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((QArrayData *)local_108.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)*local_108.a)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)*local_108.a)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)*local_108.a)->_q_value).super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)local_108.a,2,0x10);
              }
            }
            if ((Data *)local_e8.d.d != (Data *)0x0) {
              LOCK();
              ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (Option::dir_sep.d.size == 1) {
              QVar11.m_data = Option::dir_sep.d.ptr;
              QVar11.m_size = 1;
              QVar12.m_data = "\\";
              QVar12.m_size = 1;
              cVar5 = QtPrivate::equalStrings(QVar11,QVar12);
              if (cVar5 != '\0') {
                pQVar1 = this->project;
                local_108.a = (char (*) [5])
                              ((long)&(((pPVar6->super_QList<ProString>).d.ptr)->m_string).d.d +
                              lVar7);
                local_108.b.d.d = (Data *)0x2aa978;
                ProString::ProString<ProString_const&,char_const(&)[8]>
                          ((ProString *)&local_1a8,
                           (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_108);
                QMakeEvaluator::first
                          ((ProString *)local_168,&pQVar1->super_QMakeEvaluator,(ProKey *)&local_1a8
                          );
                bVar4 = ProString::contains((ProString *)local_168,"path",CaseSensitive);
                if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
                  }
                }
                if ((QArrayData *)local_1a8.a.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_1a8.a.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_1a8.a.a.a)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_1a8.a.a.a)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_1a8.a.a.a,2,0x10);
                  }
                }
                if (bVar4) {
                  ProString::toQString(&local_1e0,(ProString *)local_68);
                  windowsifyPath(&local_1c8,&local_1e0);
                  qVar2 = local_1c8.d.size;
                  local_1c8.d.size = 0;
                  ProString::toQString(&local_210,(ProString *)local_98);
                  windowsifyPath(&local_1f8,&local_210);
                  local_168._16_8_ = local_1c8.d.ptr;
                  local_168._8_8_ = local_1c8.d.d;
                  local_130 = (Data *)local_1f8.d.size;
                  pcStack_138 = local_1f8.d.ptr;
                  local_140 = (QMakeLocalFileName *)local_1f8.d.d;
                  local_1a8.a.a.a = &anon_var_dwarf_1585ec;
                  local_1a8.a.b = (char (*) [2])0x2aeb9e;
                  local_1f8.d.size = 0;
                  local_168._0_8_ = anon_var_dwarf_1585ec;
                  local_1a8.a.a.b.d.d = (Data *)0x0;
                  local_1a8.a.a.b.d.ptr = (char16_t *)0x0;
                  local_1c8.d.d = (Data *)0x0;
                  local_1c8.d.ptr = (char16_t *)0x0;
                  local_1a8.a.a.b.d.size = 0;
                  local_168._24_8_ = qVar2;
                  local_148 = (Data *)0x2aeb9e;
                  local_1a8.b.d.d = (Data *)0x0;
                  local_1a8.b.d.ptr = (char16_t *)0x0;
                  local_1f8.d.d = (Data *)0x0;
                  local_1f8.d.ptr = (char16_t *)0x0;
                  local_1a8.b.d.size = 0;
                  local_128 = ",gi";
                  pMVar9 = (MakefileGenerator *)local_168;
                  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
                  ::convertTo<QString>
                            (&local_120,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>,_const_char_(&)[4]>
                              *)local_168);
                  shellQuote(&local_e8,pMVar9,&local_120);
                  local_108.b.d.size = local_e8.d.size;
                  local_108.b.d.ptr = local_e8.d.ptr;
                  local_108.b.d.d = local_e8.d.d;
                  local_108.a = &anon_var_dwarf_1585df;
                  local_e8.d.d = (Data *)0x0;
                  local_e8.d.ptr = (char16_t *)0x0;
                  local_e8.d.size = 0;
                  ::operator+=(__return_storage_ptr__,&local_108);
                  if ((Data *)local_108.b.d.d != (Data *)0x0) {
                    LOCK();
                    ((local_108.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i = ((local_108.b.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_108.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
                        ._M_i == 0) {
                      QArrayData::deallocate(&(local_108.b.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((Data *)local_e8.d.d != (Data *)0x0) {
                    LOCK();
                    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_120.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
                  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
                                     *)local_168);
                  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[3],_QString>,_const_char_(&)[2]>,_QString>
                  ::~QStringBuilder(&local_1a8);
                  if ((QMakeLocalFileName *)local_1f8.d.d != (QMakeLocalFileName *)0x0) {
                    LOCK();
                    ((__atomic_base<int> *)&(((QString *)&(local_1f8.d.d)->super_QArrayData)->d).d)
                    ->_M_i = ((__atomic_base<int> *)
                             &(((QString *)&(local_1f8.d.d)->super_QArrayData)->d).d)->_M_i + -1;
                    UNLOCK();
                    if (((__atomic_base<int> *)
                        &(((QString *)&(local_1f8.d.d)->super_QArrayData)->d).d)->_M_i == 0) {
                      QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_210.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_210.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_210.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_210.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_1c8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (&(local_1e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_1e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_1e0.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_1e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_1e0.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
              }
            }
          }
LAB_0016bf58:
          if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_c8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x30;
        } while (uVar8 < (ulong)(pPVar6->super_QList<ProString>).d.size);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString MakefileGenerator::createSedArgs(const ProKey &replace_rule, const QString &file_name) const
{
    QString sedargs;
    if (!project->isEmpty(replace_rule) && !project->isActiveConfig("no_sed_meta_install")) {
        const ProStringList &replace_rules = project->values(replace_rule);
        for (int r = 0; r < replace_rules.size(); ++r) {
            const ProString match = project->first(ProKey(replace_rules.at(r) + ".match")),
                            replace = project->first(ProKey(replace_rules.at(r) + ".replace")),
                            filename = project->first(ProKey(replace_rules.at(r) + ".filename"));
            if (!match.isEmpty() /*&& match != replace*/
                && (filename.isEmpty() || filename == file_name)) {
                sedargs += " -e " + shellQuote("s," + match + "," + replace + ",g");
                if (isWindowsShell()
                    && project->first(ProKey(replace_rules.at(r) + ".CONFIG")).contains("path"))
                    sedargs += " -e "
                            + shellQuote("s," + windowsifyPath(match.toQString()) + ","
                                         + windowsifyPath(replace.toQString()) + ",gi");
            }
        }
    }
    return sedargs;
}